

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int parse_ignore(ly_ctx *ctx,char *data,char *endstr,uint *len)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  char *local_40;
  char *c;
  uint slen;
  uint *len_local;
  char *endstr_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  sVar3 = strlen(endstr);
  local_40 = data;
  while( true ) {
    bVar4 = false;
    if (*local_40 != '\0') {
      iVar2 = strncmp(local_40,endstr,sVar3 & 0xffffffff);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    local_40 = local_40 + 1;
  }
  cVar1 = *local_40;
  if (cVar1 != '\0') {
    *len = ((int)local_40 + (int)sVar3) - (int)data;
  }
  else {
    ly_vlog(ctx,LYE_XML_MISS,LY_VLOG_NONE,(void *)0x0,"closing sequence",endstr);
  }
  ctx_local._4_4_ = (uint)(cVar1 == '\0');
  return ctx_local._4_4_;
}

Assistant:

static int
parse_ignore(struct ly_ctx *ctx, const char *data, const char *endstr, unsigned int *len)
{
    unsigned int slen;
    const char *c = data;

    slen = strlen(endstr);

    while (*c && strncmp(c, endstr, slen)) {
        c++;
    }
    if (!*c) {
        LOGVAL(ctx, LYE_XML_MISS, LY_VLOG_NONE, NULL, "closing sequence", endstr);
        return EXIT_FAILURE;
    }
    c += slen;

    *len = c - data;
    return EXIT_SUCCESS;
}